

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.cpp
# Opt level: O0

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::case0027(TypeCanonicalizerAndResolverTester *this)

{
  Expectation *pEVar1;
  string local_1e0;
  Expectation local_1c0;
  Expectation local_108;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s;
  TypeCanonicalizerAndResolverTester *this_local;
  
  local_18 = "\nvoid _ ( )\n{\n    struct s x ;\n}\n";
  s = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"\nvoid _ ( )\n{\n    struct s x ;\n}\n",&local_39);
  Expectation::Expectation(&local_1c0);
  std::__cxx11::string::string
            ((string *)&local_1e0,
             (string *)
             &TypeCanonicalizer::DiagnosticsReporter::ID_of_TypeDeclarationNotFound_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_1c0,Error,&local_1e0);
  Expectation::Expectation(&local_108,pEVar1);
  canonicalizerAndResolveTypes(this,&local_38,&local_108);
  Expectation::~Expectation(&local_108);
  std::__cxx11::string::~string((string *)&local_1e0);
  Expectation::~Expectation(&local_1c0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void TypeCanonicalizerAndResolverTester::case0027()
{
    auto s = R"(
void _ ( )
{
    struct s x ;
}
)";

    canonicalizerAndResolveTypes(s,
            Expectation()
            .diagnostic(Expectation::ErrorOrWarn::Error,
                        TypeCanonicalizer::DiagnosticsReporter::ID_of_TypeDeclarationNotFound));
}